

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_convolve_y_sr_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  ushort uVar1;
  int16_t *piVar2;
  uint16_t uVar3;
  ulong uVar4;
  ushort *puVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ushort *puVar10;
  ushort *puVar11;
  ulong uVar12;
  long lVar13;
  
  uVar1 = filter_params_y->taps;
  piVar2 = filter_params_y->filter_ptr;
  lVar13 = (long)src_stride;
  uVar6 = 0;
  uVar12 = (ulong)(uint)w;
  if (w < 1) {
    uVar12 = uVar6;
  }
  uVar9 = (ulong)(uint)h;
  if (h < 1) {
    uVar9 = uVar6;
  }
  puVar10 = src + (1 - (ulong)(uVar1 >> 1)) * lVar13;
  for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
    puVar11 = puVar10;
    for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      iVar8 = 0;
      puVar5 = puVar11;
      for (uVar4 = 0; filter_params_y->taps != uVar4; uVar4 = uVar4 + 1) {
        iVar8 = iVar8 + (uint)*puVar5 *
                        (int)*(short *)((long)piVar2 +
                                       uVar4 * 2 + (ulong)((subpel_y_qn & 0xfU) * (uint)uVar1 * 2));
        puVar5 = puVar5 + lVar13;
      }
      uVar3 = clip_pixel_highbd(iVar8 + 0x40 >> 7,bd);
      dst[uVar6 * (long)dst_stride + uVar7] = uVar3;
      puVar11 = puVar11 + 1;
    }
    puVar10 = puVar10 + lVar13;
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_c(const uint16_t *src, int src_stride,
                                uint16_t *dst, int dst_stride, int w, int h,
                                const InterpFilterParams *filter_params_y,
                                const int subpel_y_qn, int bd) {
  const int fo_vert = filter_params_y->taps / 2 - 1;
  // vertical filter
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        res += y_filter[k] * src[(y - fo_vert + k) * src_stride + x];
      }
      dst[y * dst_stride + x] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(res, FILTER_BITS), bd);
    }
  }
}